

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Value * __thiscall wabt::interp::Thread::Pop(Value *__return_storage_ptr__,Thread *this)

{
  uint uVar1;
  undefined4 uVar2;
  bool bVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  Thread *this_local;
  
  bVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->refs_);
  if (!bVar3) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&this->refs_);
    uVar1 = *pvVar4;
    sVar5 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                      (&this->values_);
    if (sVar5 <= uVar1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&this->refs_);
    }
  }
  pvVar6 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::back
                     (&this->values_);
  (__return_storage_ptr__->field_0).i64_ = (pvVar6->field_0).i64_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) =
       *(undefined8 *)((long)&pvVar6->field_0 + 8);
  uVar2 = *(undefined4 *)&pvVar6->field_0x14;
  __return_storage_ptr__->type = (ValueType)(pvVar6->type).enum_;
  *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar2;
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::pop_back(&this->values_);
  return __return_storage_ptr__;
}

Assistant:

Value Thread::Pop() {
  if (!refs_.empty() && refs_.back() >= values_.size()) {
    refs_.pop_back();
  }
  auto value = values_.back();
  values_.pop_back();
  return value;
}